

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestGroupStats::TestGroupStats(TestGroupStats *this,TestGroupStats *param_2)

{
  long in_RSI;
  undefined8 *in_RDI;
  Totals *in_stack_ffffffffffffffc8;
  Totals *this_00;
  
  *in_RDI = &PTR__TestGroupStats_00294920;
  this_00 = (Totals *)(in_RDI + 1);
  GroupInfo::GroupInfo((GroupInfo *)this_00,(GroupInfo *)in_stack_ffffffffffffffc8);
  Totals::Totals(this_00,in_stack_ffffffffffffffc8);
  *(byte *)(in_RDI + 0x15) = *(byte *)(in_RSI + 0xa8) & 1;
  return;
}

Assistant:

TestGroupStats( TestGroupStats const& )              = default;